

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

array<int,_8UL> * dgrminer::smallerDirectionOfAdjacencyInfo(array<int,_8UL> *adjacencyinfo)

{
  undefined8 uVar1;
  long lVar2;
  array<int,_8UL> *in_RDI;
  array<int,_8UL> newadjacencyinfo;
  
  uVar1 = *(undefined8 *)(adjacencyinfo->_M_elems + 5);
  newadjacencyinfo._M_elems[0] = (int)uVar1;
  newadjacencyinfo._M_elems[1] = SUB84(uVar1,4);
  newadjacencyinfo._M_elems[2] = adjacencyinfo->_M_elems[2];
  if (newadjacencyinfo._M_elems[2] == 1) {
    newadjacencyinfo._M_elems[2] = 2;
  }
  else if (newadjacencyinfo._M_elems[2] == 2) {
    newadjacencyinfo._M_elems[2] = 1;
  }
  newadjacencyinfo._M_elems[5] = adjacencyinfo->_M_elems[0];
  newadjacencyinfo._M_elems[6] = adjacencyinfo->_M_elems[1];
  newadjacencyinfo._M_elems[3] = adjacencyinfo->_M_elems[3];
  newadjacencyinfo._M_elems[4] = adjacencyinfo->_M_elems[4];
  newadjacencyinfo._M_elems[7] = adjacencyinfo->_M_elems[7];
  lVar2 = 0;
  do {
    if (adjacencyinfo->_M_elems[lVar2] < newadjacencyinfo._M_elems[lVar2]) break;
    if (newadjacencyinfo._M_elems[lVar2] < adjacencyinfo->_M_elems[lVar2]) {
      newadjacencyinfo._M_elems[0] = (int)uVar1;
      newadjacencyinfo._M_elems[1] = SUB84(uVar1,4);
      goto LAB_0011ea11;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  newadjacencyinfo._M_elems[0] = adjacencyinfo->_M_elems[0];
  newadjacencyinfo._M_elems[1] = adjacencyinfo->_M_elems[1];
  newadjacencyinfo._M_elems[2] = adjacencyinfo->_M_elems[2];
  newadjacencyinfo._M_elems[3] = adjacencyinfo->_M_elems[3];
  newadjacencyinfo._M_elems[4] = adjacencyinfo->_M_elems[4];
  newadjacencyinfo._M_elems[5] = adjacencyinfo->_M_elems[5];
  newadjacencyinfo._M_elems[6] = adjacencyinfo->_M_elems[6];
  newadjacencyinfo._M_elems[7] = adjacencyinfo->_M_elems[7];
LAB_0011ea11:
  in_RDI->_M_elems[4] = newadjacencyinfo._M_elems[4];
  in_RDI->_M_elems[5] = newadjacencyinfo._M_elems[5];
  in_RDI->_M_elems[6] = newadjacencyinfo._M_elems[6];
  in_RDI->_M_elems[7] = newadjacencyinfo._M_elems[7];
  in_RDI->_M_elems[0] = newadjacencyinfo._M_elems[0];
  in_RDI->_M_elems[1] = newadjacencyinfo._M_elems[1];
  in_RDI->_M_elems[2] = newadjacencyinfo._M_elems[2];
  in_RDI->_M_elems[3] = newadjacencyinfo._M_elems[3];
  return in_RDI;
}

Assistant:

std::array<int, 8> smallerDirectionOfAdjacencyInfo(std::array<int, 8> &adjacencyinfo)
    {

        std::array<int, 8> flipped = flipAdjacencyInfo(adjacencyinfo);
        for (int i = 0; i < 8; i++)
        {
            if (adjacencyinfo[i] < flipped[i])
            {
                return adjacencyinfo;
            }
            else if (adjacencyinfo[i] > flipped[i])
            {
                return flipped;
            }
        }
        return adjacencyinfo;
    }